

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int checkTreePage(IntegrityCk *pCheck,int iPage,char *zParentContext,i64 *pnParentMinKey,
                 i64 *pnParentMaxKey)

{
  undefined1 uVar1;
  BtShared *pBt;
  IntegrityCk *pCheck_00;
  long lVar2;
  i64 iVar3;
  ushort uVar4;
  u16 uVar5;
  int iVar6;
  uint uVar7;
  u32 uVar8;
  uint uVar9;
  void *__s;
  undefined1 *puVar10;
  undefined1 *puVar11;
  ulong uVar12;
  char *pcVar13;
  i64 *piVar14;
  long *plVar15;
  u8 *pCell;
  ulong uVar16;
  long *plVar17;
  int local_11c;
  i64 nMaxKey;
  BtShared *local_108;
  long *local_100;
  uint local_f4;
  long *local_f0;
  IntegrityCk *local_e8;
  i64 nMinKey;
  long local_d8;
  ulong local_d0;
  u32 local_c8;
  int local_c4;
  MemPage *pPage;
  CellInfo info;
  char zContext [100];
  
  nMinKey = 0;
  nMaxKey = 0;
  sqlite3_snprintf(100,zContext,"Page %d: ");
  if (iPage == 0) {
    return 0;
  }
  pBt = pCheck->pBt;
  uVar9 = pBt->usableSize;
  local_100 = pnParentMinKey;
  local_f0 = pnParentMaxKey;
  iVar6 = checkRef(pCheck,iPage,zParentContext);
  if (iVar6 != 0) {
    return 0;
  }
  uVar7 = btreeGetPage(pBt,iPage,&pPage,0,0);
  if (uVar7 != 0) {
    checkAppendMsg(pCheck,zContext,"unable to get the page. error code=%d",(ulong)uVar7);
    return 0;
  }
  pPage->isInit = '\0';
  uVar7 = btreeInitPage(pPage);
  if (uVar7 != 0) {
    checkAppendMsg(pCheck,zContext,"btreeInitPage() returns error code %d",(ulong)uVar7);
    releasePage(pPage);
    return 0;
  }
  local_c4 = uVar9 - 5;
  local_f4 = uVar9 - 4;
  uVar16 = 0;
  local_11c = 0;
  local_108 = pBt;
  local_e8 = pCheck;
  local_d0 = (ulong)uVar9;
  while ((plVar17 = local_f0, plVar15 = local_100, uVar16 < pPage->nCell && (pCheck->mxErr != 0))) {
    sqlite3_snprintf(100,zContext,"On tree page %d cell %d: ",iPage,uVar16 & 0xffffffff);
    pCell = pPage->aData +
            (CONCAT11(pPage->aCellIdx[uVar16 * 2],pPage->aCellIdx[uVar16 * 2 + 1]) & pPage->maskPage
            );
    btreeParseCellPtr(pPage,pCell,&info);
    uVar8 = info.nData;
    if (pPage->intKey == '\0') {
      uVar8 = info.nData + (int)info.nKey;
      lVar2 = nMaxKey;
      iVar3 = nMinKey;
    }
    else {
      lVar2 = CONCAT44(info.nKey._4_4_,(int)info.nKey);
      iVar3 = lVar2;
      if ((uVar16 != 0) && (iVar3 = nMinKey, lVar2 <= nMaxKey)) {
        checkAppendMsg(local_e8,zContext,"Rowid %lld out of order (previous was %lld)",lVar2);
        iVar3 = nMinKey;
      }
    }
    nMinKey = iVar3;
    nMaxKey = lVar2;
    if ((info.nLocal < uVar8) && (pCell + info.iOverflow <= pPage->aData + local_108->usableSize)) {
      local_d8 = CONCAT44(local_d8._4_4_,((uVar8 + local_c4) - (uint)info.nLocal) / local_f4);
      uVar8 = sqlite3Get4byte(pCell + info.iOverflow);
      pCheck_00 = local_e8;
      if (local_108->autoVacuum != '\0') {
        local_c8 = uVar8;
        checkPtrmap(local_e8,uVar8,'\x03',iPage,zContext);
        uVar8 = local_c8;
      }
      checkList(pCheck_00,0,uVar8,(int)local_d8,zContext);
    }
    pCheck = local_e8;
    iVar6 = local_11c;
    if (pPage->leaf == '\0') {
      uVar8 = sqlite3Get4byte(pCell);
      pCheck = local_e8;
      if (local_108->autoVacuum != '\0') {
        checkPtrmap(local_e8,uVar8,'\x05',iPage,zContext);
      }
      piVar14 = &nMaxKey;
      if (uVar16 == 0) {
        piVar14 = (i64 *)0x0;
      }
      iVar6 = checkTreePage(pCheck,uVar8,zContext,&nMinKey,piVar14);
      if ((uVar16 != 0) && (iVar6 != local_11c)) {
        checkAppendMsg(pCheck,zContext,"Child page depth differs");
      }
    }
    uVar16 = uVar16 + 1;
    local_11c = iVar6;
  }
  if (pPage->leaf == '\0') {
    uVar8 = sqlite3Get4byte(pPage->aData + (ulong)pPage->hdrOffset + 8);
    sqlite3_snprintf(100,zContext,"On page %d at right child: ");
    if (local_108->autoVacuum != '\0') {
      checkPtrmap(pCheck,uVar8,'\x05',iPage,zContext);
    }
    piVar14 = &nMaxKey;
    if (pPage->nCell == 0) {
      piVar14 = (i64 *)0x0;
    }
    checkTreePage(pCheck,uVar8,zContext,(i64 *)0x0,piVar14);
    if (pPage->leaf == '\0') goto LAB_0013cbe7;
  }
  if (pPage->intKey == '\0') goto LAB_0013cbe7;
  if (plVar15 == (long *)0x0) {
    if ((plVar17 == (long *)0x0) || (*plVar17 < nMinKey)) goto LAB_0013cbe7;
    pcVar13 = "Rowid %lld out of order (min less than parent max of %lld)";
  }
  else {
    if (plVar17 != (long *)0x0) {
      if (nMinKey <= *plVar15) {
        checkAppendMsg(pCheck,zContext,"Rowid %lld out of order (min less than parent min of %lld)")
        ;
      }
      if (*plVar17 < nMaxKey) {
        checkAppendMsg(pCheck,zContext,
                       "Rowid %lld out of order (max larger than parent max of %lld)");
      }
      *plVar15 = nMaxKey;
      goto LAB_0013cbe7;
    }
    if (nMaxKey <= *plVar15) goto LAB_0013cbe7;
    pcVar13 = "Rowid %lld out of order (max larger than parent min of %lld)";
  }
  checkAppendMsg(pCheck,zContext,pcVar13);
LAB_0013cbe7:
  plVar15 = (long *)pPage->aData;
  uVar16 = (ulong)pPage->hdrOffset;
  __s = pcache1Alloc(local_108->pageSize);
  if (__s == (void *)0x0) {
    pCheck->mallocFailed = 1;
  }
  else {
    local_d8 = (long)plVar15 + uVar16;
    uVar9 = ((uint)*(byte *)((long)plVar15 + uVar16 + 5) * 0x100 +
            (uint)*(byte *)((long)plVar15 + uVar16 + 6)) - 1 & 0xffff;
    local_100 = (long *)((ulong)uVar9 + 1);
    memset((void *)((long)__s + (ulong)uVar9 + 1),0,(long)(int)(~uVar9 + (int)local_d0));
    memset(__s,1,(size_t)local_100);
    uVar4 = *(ushort *)((long)plVar15 + uVar16 + 3);
    local_100 = (long *)(ulong)(ushort)(uVar4 << 8 | uVar4 >> 8);
    local_108 = (BtShared *)((long)plVar15 + uVar16 + (ulong)pPage->leaf * -4 + 0xc);
    local_f0 = plVar15;
    for (plVar17 = (long *)0x0; lVar2 = local_d8, plVar17 != local_100;
        plVar17 = (long *)((long)plVar17 + 1)) {
      uVar4 = *(ushort *)((long)&local_108->pPager + (long)plVar17 * 2);
      uVar4 = uVar4 << 8 | uVar4 >> 8;
      uVar9 = 0x10000;
      if (uVar4 == local_f4 || (int)(uint)uVar4 < (int)local_f4) {
        uVar5 = cellSizePtr(pPage,(u8 *)((long)plVar15 + (ulong)uVar4));
        uVar9 = (uint)uVar5;
        plVar15 = local_f0;
      }
      uVar9 = uVar9 + uVar4;
      if ((int)local_d0 < (int)uVar9) {
        checkAppendMsg(pCheck,(char *)0x0,"Corruption detected in cell %d on page %d",
                       (ulong)plVar17 & 0xffffffff,iPage);
        plVar15 = local_f0;
      }
      else {
        for (uVar16 = (ulong)uVar9; (long)(ulong)uVar4 < (long)uVar16; uVar16 = uVar16 - 1) {
          pcVar13 = (char *)((long)__s + (uVar16 - 1));
          *pcVar13 = *pcVar13 + '\x01';
        }
      }
    }
    puVar10 = (undefined1 *)(local_d8 + 1);
    puVar11 = (undefined1 *)(local_d8 + 2);
    while( true ) {
      uVar1 = *puVar10;
      uVar16 = (ulong)CONCAT11(uVar1,*puVar11);
      if (uVar16 == 0) break;
      puVar10 = (undefined1 *)((long)plVar15 + uVar16);
      for (uVar12 = (ulong)((uint)*(byte *)((long)plVar15 + uVar16 + 3) +
                            (uint)CONCAT11(uVar1,*puVar11) +
                           (uint)*(byte *)((long)plVar15 + uVar16 + 2) * 0x100);
          (long)uVar16 < (long)uVar12; uVar12 = uVar12 - 1) {
        pcVar13 = (char *)((long)__s + (uVar12 - 1));
        *pcVar13 = *pcVar13 + '\x01';
      }
      puVar11 = puVar10 + 1;
    }
    uVar12 = 0;
    uVar16 = local_d0 & 0xffffffff;
    if ((int)local_d0 < 1) {
      uVar16 = uVar12;
    }
    uVar9 = 0;
    for (; uVar16 != uVar12; uVar12 = uVar12 + 1) {
      if (*(char *)((long)__s + uVar12) == '\0') {
        uVar9 = uVar9 + 1;
      }
      else if ('\x01' < *(char *)((long)__s + uVar12)) {
        checkAppendMsg(pCheck,(char *)0x0,"Multiple uses for byte %d of page %d",uVar12,iPage);
        break;
      }
    }
    if (uVar9 != *(byte *)(lVar2 + 7)) {
      checkAppendMsg(pCheck,(char *)0x0,"Fragmentation of %d bytes reported as %d on page %d",
                     (ulong)uVar9,(ulong)*(byte *)(lVar2 + 7),iPage);
    }
  }
  pcache1Free(__s);
  releasePage(pPage);
  return local_11c + 1;
}

Assistant:

static int checkTreePage(
  IntegrityCk *pCheck,  /* Context for the sanity check */
  int iPage,            /* Page number of the page to check */
  char *zParentContext, /* Parent context */
  i64 *pnParentMinKey, 
  i64 *pnParentMaxKey
){
  MemPage *pPage;
  int i, rc, depth, d2, pgno, cnt;
  int hdr, cellStart;
  int nCell;
  u8 *data;
  BtShared *pBt;
  int usableSize;
  char zContext[100];
  char *hit = 0;
  i64 nMinKey = 0;
  i64 nMaxKey = 0;

  sqlite3_snprintf(sizeof(zContext), zContext, "Page %d: ", iPage);

  /* Check that the page exists
  */
  pBt = pCheck->pBt;
  usableSize = pBt->usableSize;
  if( iPage==0 ) return 0;
  if( checkRef(pCheck, iPage, zParentContext) ) return 0;
  if( (rc = btreeGetPage(pBt, (Pgno)iPage, &pPage, 0, 0))!=0 ){
    checkAppendMsg(pCheck, zContext,
       "unable to get the page. error code=%d", rc);
    return 0;
  }

  /* Clear MemPage.isInit to make sure the corruption detection code in
  ** btreeInitPage() is executed.  */
  pPage->isInit = 0;
  if( (rc = btreeInitPage(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );  /* The only possible error from InitPage */
    checkAppendMsg(pCheck, zContext, 
                   "btreeInitPage() returns error code %d", rc);
    releasePage(pPage);
    return 0;
  }

  /* Check out all the cells.
  */
  depth = 0;
  for(i=0; i<pPage->nCell && pCheck->mxErr; i++){
    u8 *pCell;
    u32 sz;
    CellInfo info;

    /* Check payload overflow pages
    */
    sqlite3_snprintf(sizeof(zContext), zContext,
             "On tree page %d cell %d: ", iPage, i);
    pCell = findCell(pPage,i);
    btreeParseCellPtr(pPage, pCell, &info);
    sz = info.nData;
    if( !pPage->intKey ) sz += (int)info.nKey;
    /* For intKey pages, check that the keys are in order.
    */
    else if( i==0 ) nMinKey = nMaxKey = info.nKey;
    else{
      if( info.nKey <= nMaxKey ){
        checkAppendMsg(pCheck, zContext, 
            "Rowid %lld out of order (previous was %lld)", info.nKey, nMaxKey);
      }
      nMaxKey = info.nKey;
    }
    assert( sz==info.nPayload );
    if( (sz>info.nLocal) 
     && (&pCell[info.iOverflow]<=&pPage->aData[pBt->usableSize])
    ){
      int nPage = (sz - info.nLocal + usableSize - 5)/(usableSize - 4);
      Pgno pgnoOvfl = get4byte(&pCell[info.iOverflow]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgnoOvfl, PTRMAP_OVERFLOW1, iPage, zContext);
      }
#endif
      checkList(pCheck, 0, pgnoOvfl, nPage, zContext);
    }

    /* Check sanity of left child page.
    */
    if( !pPage->leaf ){
      pgno = get4byte(pCell);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage, zContext);
      }
#endif
      d2 = checkTreePage(pCheck, pgno, zContext, &nMinKey, i==0 ? NULL : &nMaxKey);
      if( i>0 && d2!=depth ){
        checkAppendMsg(pCheck, zContext, "Child page depth differs");
      }
      depth = d2;
    }
  }

  if( !pPage->leaf ){
    pgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    sqlite3_snprintf(sizeof(zContext), zContext, 
                     "On page %d at right child: ", iPage);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage, zContext);
    }
#endif
    checkTreePage(pCheck, pgno, zContext, NULL, !pPage->nCell ? NULL : &nMaxKey);
  }
 
  /* For intKey leaf pages, check that the min/max keys are in order
  ** with any left/parent/right pages.
  */
  if( pPage->leaf && pPage->intKey ){
    /* if we are a left child page */
    if( pnParentMinKey ){
      /* if we are the left most child page */
      if( !pnParentMaxKey ){
        if( nMaxKey > *pnParentMinKey ){
          checkAppendMsg(pCheck, zContext, 
              "Rowid %lld out of order (max larger than parent min of %lld)",
              nMaxKey, *pnParentMinKey);
        }
      }else{
        if( nMinKey <= *pnParentMinKey ){
          checkAppendMsg(pCheck, zContext, 
              "Rowid %lld out of order (min less than parent min of %lld)",
              nMinKey, *pnParentMinKey);
        }
        if( nMaxKey > *pnParentMaxKey ){
          checkAppendMsg(pCheck, zContext, 
              "Rowid %lld out of order (max larger than parent max of %lld)",
              nMaxKey, *pnParentMaxKey);
        }
        *pnParentMinKey = nMaxKey;
      }
    /* else if we're a right child page */
    } else if( pnParentMaxKey ){
      if( nMinKey <= *pnParentMaxKey ){
        checkAppendMsg(pCheck, zContext, 
            "Rowid %lld out of order (min less than parent max of %lld)",
            nMinKey, *pnParentMaxKey);
      }
    }
  }

  /* Check for complete coverage of the page
  */
  data = pPage->aData;
  hdr = pPage->hdrOffset;
  hit = sqlite3PageMalloc( pBt->pageSize );
  if( hit==0 ){
    pCheck->mallocFailed = 1;
  }else{
    int contentOffset = get2byteNotZero(&data[hdr+5]);
    assert( contentOffset<=usableSize );  /* Enforced by btreeInitPage() */
    memset(hit+contentOffset, 0, usableSize-contentOffset);
    memset(hit, 1, contentOffset);
    nCell = get2byte(&data[hdr+3]);
    cellStart = hdr + 12 - 4*pPage->leaf;
    for(i=0; i<nCell; i++){
      int pc = get2byte(&data[cellStart+i*2]);
      u32 size = 65536;
      int j;
      if( pc<=usableSize-4 ){
        size = cellSizePtr(pPage, &data[pc]);
      }
      if( (int)(pc+size-1)>=usableSize ){
        checkAppendMsg(pCheck, 0, 
            "Corruption detected in cell %d on page %d",i,iPage);
      }else{
        for(j=pc+size-1; j>=pc; j--) hit[j]++;
      }
    }
    i = get2byte(&data[hdr+1]);
    while( i>0 ){
      int size, j;
      assert( i<=usableSize-4 );     /* Enforced by btreeInitPage() */
      size = get2byte(&data[i+2]);
      assert( i+size<=usableSize );  /* Enforced by btreeInitPage() */
      for(j=i+size-1; j>=i; j--) hit[j]++;
      j = get2byte(&data[i]);
      assert( j==0 || j>i+size );  /* Enforced by btreeInitPage() */
      assert( j<=usableSize-4 );   /* Enforced by btreeInitPage() */
      i = j;
    }
    for(i=cnt=0; i<usableSize; i++){
      if( hit[i]==0 ){
        cnt++;
      }else if( hit[i]>1 ){
        checkAppendMsg(pCheck, 0,
          "Multiple uses for byte %d of page %d", i, iPage);
        break;
      }
    }
    if( cnt!=data[hdr+7] ){
      checkAppendMsg(pCheck, 0, 
          "Fragmentation of %d bytes reported as %d on page %d",
          cnt, data[hdr+7], iPage);
    }
  }
  sqlite3PageFree(hit);
  releasePage(pPage);
  return depth+1;
}